

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

UtcTimeStamp * __thiscall
FIX::SessionState::getCreationTime(UtcTimeStamp *__return_storage_ptr__,SessionState *this)

{
  Mutex::lock(&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[10])(__return_storage_ptr__);
  Mutex::unlock(&this->m_mutex);
  return __return_storage_ptr__;
}

Assistant:

UtcTimeStamp getCreationTime() const EXCEPT ( IOException )
  { Locker l( m_mutex ); return m_pStore->getCreationTime(); }